

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void check_call_loop_wrappage(Context *ctx,int regnum)

{
  RegisterList *item;
  RegisterList *pRVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  
  pRVar1 = (ctx->used_registers).next;
  if (pRVar1 != (RegisterList *)0x0) {
    iVar2 = (uint)(0 < ctx->loops) * 2 + -1;
    do {
      uVar4 = pRVar1->regtype << 0x10 | pRVar1->regnum;
      if ((regnum | 0x120000U) == uVar4) {
        if (pRVar1->misc == 0) {
          pRVar1->misc = iVar2;
        }
        else if (pRVar1->misc != iVar2) {
          if (ctx->loops < 1) {
            pcVar3 = "CALL to this label must not be wrapped in LOOP/ENDLOOP";
          }
          else {
            pcVar3 = "CALL to this label must be wrapped in LOOP/ENDLOOP";
          }
          goto LAB_00122c00;
        }
        return;
      }
    } while ((uVar4 <= (regnum | 0x120000U)) &&
            (pRVar1 = pRVar1->next, pRVar1 != (RegisterList *)0x0));
  }
  pcVar3 = "Invalid label for CALL";
LAB_00122c00:
  failf(ctx,"%s",pcVar3);
  return;
}

Assistant:

static void check_call_loop_wrappage(Context *ctx, const int regnum)
{
    // msdn says subroutines inherit aL register if you're in a loop when
    //  you call, and further more _if you ever call this function in a loop,
    //  it must always be called in a loop_. So we'll just pass our loop
    //  variable as a function parameter in those cases.

    const int current_usage = (ctx->loops > 0) ? 1 : -1;
    RegisterList *reg = reglist_find(&ctx->used_registers, REG_TYPE_LABEL, regnum);

    if (reg == NULL)
        fail(ctx, "Invalid label for CALL");
    else if (reg->misc == 0)
        reg->misc = current_usage;
    else if (reg->misc != current_usage)
    {
        if (current_usage == 1)
            fail(ctx, "CALL to this label must be wrapped in LOOP/ENDLOOP");
        else
            fail(ctx, "CALL to this label must not be wrapped in LOOP/ENDLOOP");
    } // else if
}